

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  char *__s2;
  char *__s1;
  size_t sVar6;
  int local_64;
  int i;
  char *pName;
  char *pToken;
  char *pLimit;
  char *pBuffer;
  char *pTemp;
  int local_30;
  int fComment;
  int Pos;
  int First;
  Vec_Int_t *vPlaces;
  Vec_Ptr_t *vNames_local;
  char *pFileName_local;
  
  bVar2 = true;
  local_30 = -1;
  bVar1 = false;
  __s = Extra_FileReadContents(pFileName);
  sVar5 = strlen(__s);
  if (__s == (char *)0x0) {
    pFileName_local = (char *)0x0;
  }
  else {
    iVar3 = Vec_PtrSize(vNames);
    pFileName_local = (char *)Vec_IntAlloc(iVar3);
    for (pBuffer = __s; *pBuffer != '\0'; pBuffer = pBuffer + 1) {
      if (*pBuffer == '\n') {
        bVar1 = false;
      }
      if ((*pBuffer == '/') && (pBuffer[1] == '/')) {
        bVar1 = true;
      }
      if (!bVar1) {
        if (*pBuffer == '\n') {
          local_30 = ((int)pBuffer - (int)__s) + 1;
        }
        else if (*pBuffer == '(') {
          if (bVar2) {
            bVar2 = false;
          }
          else {
            __s2 = strtok(pBuffer + 1,"  \n\r\t,");
            for (local_64 = 0; iVar3 = Vec_PtrSize(vNames), local_64 < iVar3;
                local_64 = local_64 + 1) {
              __s1 = (char *)Vec_PtrEntry(vNames,local_64);
              iVar3 = strcmp(__s1,__s2);
              if (iVar3 == 0) {
                Vec_IntPushTwo((Vec_Int_t *)pFileName_local,local_30,local_64);
              }
            }
            sVar6 = strlen(__s2);
            for (pBuffer = __s2 + sVar6; *pBuffer == '\0'; pBuffer = pBuffer + 1) {
            }
            if (__s + sVar5 <= pBuffer) {
              __assert_fail("pTemp < pLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                            ,0x40a,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
            }
          }
        }
      }
    }
    iVar3 = Vec_IntSize((Vec_Int_t *)pFileName_local);
    iVar4 = Vec_PtrSize(vNames);
    if (iVar3 != iVar4 * 2) {
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                    ,0x40e,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1, fComment = 0;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            fComment = 0;
        if ( *pTemp == '/' && *(pTemp + 1) == '/' )
            fComment = 1;
        if ( fComment )
            continue;

        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t," );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}